

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_UInt16 UA_Server_run_iterate(UA_Server *server,UA_Boolean waitInternal)

{
  UA_ByteString *message;
  RepeatedJob *pRVar1;
  RepeatedJob **ppRVar2;
  RepeatedJob *pRVar3;
  UA_ServerNetworkLayer *pUVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  UA_UInt16 UVar7;
  UA_StatusCode UVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  RepeatedJob *pRVar12;
  UA_UInt16 UVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  RepeatedJob *pRVar17;
  RepeatedJob *pRVar18;
  RepeatedJob *pRVar19;
  size_t sVar20;
  RepeatedJob *local_a8;
  timespec ts;
  UA_Boolean local_31;
  
  clock_gettime(4,(timespec *)&stack0xffffffffffffff58);
  lVar16 = ts.tv_sec / 100 + (long)local_a8 * 10000000;
  pRVar19 = (server->repeatedJobs).lh_first;
  if ((pRVar19 == (RepeatedJob *)0x0) || (pRVar18 = pRVar19, lVar16 < pRVar19->nextTime)) {
    pRVar12 = (RepeatedJob *)0x0;
  }
  else {
    do {
      pRVar12 = pRVar18;
      pRVar18 = (pRVar12->next).le_next;
      if (pRVar18 == (RepeatedJob *)0x0) break;
    } while (pRVar18->nextTime <= lVar16);
  }
  ts.tv_nsec = lVar16 + -1;
  if (pRVar19 != (RepeatedJob *)0x0) {
    pRVar18 = (RepeatedJob *)&stack0xffffffffffffff58;
    do {
      if (lVar16 < pRVar19->nextTime) break;
      pRVar1 = (pRVar19->next).le_next;
      ppRVar2 = (pRVar19->next).le_prev;
      processJob(server,&pRVar19->job);
      pRVar17 = pRVar18;
      if (*ppRVar2 == pRVar19) {
        lVar9 = pRVar19->nextTime + pRVar19->interval;
        if (lVar9 < lVar16) {
          lVar9 = lVar16 + 1;
        }
        pRVar19->nextTime = lVar9;
        if (pRVar18->nextTime == lVar9) {
          if (pRVar18 == (RepeatedJob *)&stack0xffffffffffffff58) {
            __assert_fail("last_dispatched != &tmp_last",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x46c4,
                          "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)")
            ;
          }
        }
        else {
          pRVar17 = pRVar12;
          if (pRVar12 == (RepeatedJob *)0x0) {
            __assert_fail("lastNow",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x46c9,
                          "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)")
            ;
          }
          do {
            pRVar18 = (pRVar17->next).le_next;
            if (pRVar18 == (RepeatedJob *)0x0) {
              bVar5 = false;
              pRVar18 = pRVar17;
            }
            else {
              bVar5 = pRVar18->nextTime < lVar9;
              if (lVar9 <= pRVar18->nextTime) {
                pRVar18 = pRVar17;
              }
            }
            pRVar17 = pRVar18;
          } while (bVar5);
        }
        pRVar17 = pRVar19;
        if (pRVar18 != pRVar19) {
          pRVar3 = (pRVar19->next).le_next;
          if (pRVar3 != (RepeatedJob *)0x0) {
            (pRVar3->next).le_prev = (pRVar19->next).le_prev;
          }
          *(pRVar19->next).le_prev = pRVar3;
          pRVar3 = (pRVar18->next).le_next;
          (pRVar19->next).le_next = pRVar3;
          if (pRVar3 != (RepeatedJob *)0x0) {
            (((pRVar18->next).le_next)->next).le_prev = (RepeatedJob **)pRVar19;
          }
          (pRVar18->next).le_next = pRVar19;
          (pRVar19->next).le_prev = (RepeatedJob **)pRVar18;
        }
      }
      pRVar18 = pRVar17;
      pRVar19 = pRVar1;
    } while (pRVar1 != (RepeatedJob *)0x0);
  }
  pRVar19 = (server->repeatedJobs).lh_first;
  lVar9 = lVar16 + 500000;
  if ((pRVar19 != (RepeatedJob *)0x0) && (lVar14 = pRVar19->nextTime, lVar14 < lVar9)) {
    lVar9 = lVar14;
  }
  if (waitInternal) {
    auVar6 = SEXT816(lVar9 - lVar16) * SEXT816(0x346dc5d63886594b);
    UVar13 = (short)(auVar6._8_4_ >> 0xb) - (auVar6._14_2_ >> 0xf);
  }
  else {
    UVar13 = 0;
  }
  uVar10 = (server->config).networkLayersSize;
  if (uVar10 != 0) {
    uVar15 = 0;
    do {
      pUVar4 = (server->config).networkLayers;
      local_a8 = (RepeatedJob *)0x0;
      UVar7 = 0;
      if (uVar15 == uVar10 - 1) {
        UVar7 = UVar13;
      }
      sVar11 = (*pUVar4[uVar15].getJobs)(pUVar4 + uVar15,(UA_Job **)&stack0xffffffffffffff58,UVar7);
      if (sVar11 != 0) {
        lVar16 = 0x10;
        sVar20 = sVar11;
        do {
          pRVar19 = local_a8;
          if (*(int *)((long)(&local_a8->id + -3) + lVar16) == 2) {
            local_31 = false;
            message = (UA_ByteString *)
                      ((long)&((RepeatedJob *)
                              (&((RepeatedJob *)(&((RepeatedJob *)(&local_a8->id + -2))->id + -2))->
                                id + -2))->id + lVar16 + 0xffffffffffffffe0U);
            UVar8 = UA_Connection_completeMessages
                              (*(UA_Connection **)((local_a8->id).data4 + lVar16 + -0x30),message,
                               &local_31);
            if (UVar8 == 0) {
              if (local_31 == true) {
                *(undefined4 *)((long)(&pRVar19->id + -3) + lVar16) = 3;
              }
              if (message->length != 0) goto LAB_0011c234;
            }
            else if (UVar8 == 0x80030000) {
              UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_NETWORK,
                             "Lost message(s) from Connection %i as memory could not be allocated",
                             (ulong)*(uint *)(*(long *)((pRVar19->id).data4 + lVar16 + -0x30) + 0x38
                                             ));
            }
            else {
              UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_NETWORK,
                          "Could not merge half-received messages on Connection %i with error 0x%08x"
                          ,(ulong)*(uint *)(*(long *)((pRVar19->id).data4 + lVar16 + -0x30) + 0x38),
                          (ulong)UVar8);
            }
            *(undefined4 *)((long)(&pRVar19->id + -3) + lVar16) = 0;
          }
LAB_0011c234:
          lVar16 = lVar16 + 0x20;
          sVar20 = sVar20 - 1;
        } while (sVar20 != 0);
        lVar16 = 0;
        do {
          processJob(server,(UA_Job *)
                            ((long)&((RepeatedJob *)
                                    (&((RepeatedJob *)
                                      (&((RepeatedJob *)(&local_a8->id + -2))->id + -2))->id + -2))
                                    ->id + lVar16 + 0xffffffffffffffe0U));
          lVar16 = lVar16 + 0x20;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        free(local_a8);
      }
      uVar15 = uVar15 + 1;
      uVar10 = (server->config).networkLayersSize;
    } while (uVar15 < uVar10);
  }
  processDelayedCallbacks(server);
  clock_gettime(4,(timespec *)&stack0xffffffffffffff58);
  lVar14 = ts.tv_sec / 100 + (long)local_a8 * 10000000;
  lVar16 = lVar9 - lVar14;
  if (lVar16 == 0 || lVar9 < lVar14) {
    UVar13 = 0;
  }
  else {
    auVar6 = SEXT816(lVar16) * SEXT816(0x346dc5d63886594b);
    UVar13 = (short)(auVar6._8_8_ >> 0xb) - (auVar6._14_2_ >> 0xf);
  }
  return UVar13;
}

Assistant:

UA_UInt16 UA_Server_run_iterate(UA_Server *server, UA_Boolean waitInternal) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Run work assigned for the main thread */
    processMainLoopJobs(server);
#endif
    /* Process repeated work */
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_Boolean dispatched = false; /* to wake up worker threads */
    UA_DateTime nextRepeated = processRepeatedJobs(server, now, &dispatched);

    UA_UInt16 timeout = 0;
    if(waitInternal)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);

    /* Get work from the networklayer */
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *jobs = NULL;
        size_t jobsSize;
        /* only the last networklayer waits on the tieout */
        if(i == server->config.networkLayersSize-1)
            jobsSize = nl->getJobs(nl, &jobs, timeout);
        else
            jobsSize = nl->getJobs(nl, &jobs, 0);

        for(size_t k = 0; k < jobsSize; ++k) {
#ifdef UA_ENABLE_MULTITHREADING
            /* Filter out delayed work */
            if(jobs[k].type == UA_JOBTYPE_METHODCALL_DELAYED) {
                addDelayedJob(server, &jobs[k]);
                jobs[k].type = UA_JOBTYPE_NOTHING;
                continue;
            }
#endif
            /* Merge half-received messages */
            if(jobs[k].type == UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER)
                completeMessages(server, &jobs[k]);
        }

        /* Dispatch/process jobs */
        for(size_t j = 0; j < jobsSize; ++j) {
#ifdef UA_ENABLE_MULTITHREADING
            dispatchJob(server, &jobs[j]);
            dispatched = true;
#else
            processJob(server, &jobs[j]);
#endif
        }

        /* Clean up jobs list */
        if(jobsSize > 0)
            UA_free(jobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Wake up worker threads */
    if(dispatched)
        pthread_cond_broadcast(&server->dispatchQueue_condition);
#else
    processDelayedCallbacks(server);
#endif

    now = UA_DateTime_nowMonotonic();
    timeout = 0;
    if(nextRepeated > now)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);
    return timeout;
}